

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void queueReaderRegisterMsgAndNotify(SstStream Stream,_ReaderRegisterMsg *Req,CMConnection conn)

{
  undefined8 *puVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  RegisterQueue Last;
  RegisterQueue New;
  long local_28;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0xc0));
  puVar1 = (undefined8 *)malloc(0x18);
  *puVar1 = in_RSI;
  puVar1[1] = in_RDX;
  puVar1[2] = 0;
  if (*(long *)(in_RDI + 0x180) == 0) {
    *(undefined8 **)(in_RDI + 0x180) = puVar1;
  }
  else {
    for (local_28 = *(long *)(in_RDI + 0x180); *(long *)(local_28 + 0x10) != 0;
        local_28 = *(long *)(local_28 + 0x10)) {
    }
    *(undefined8 **)(local_28 + 0x10) = puVar1;
  }
  pthread_cond_signal((pthread_cond_t *)(in_RDI + 0xe8));
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0xc0));
  return;
}

Assistant:

void queueReaderRegisterMsgAndNotify(SstStream Stream, struct _ReaderRegisterMsg *Req,
                                     CMConnection conn)
{
    STREAM_MUTEX_LOCK(Stream);
    RegisterQueue New = malloc(sizeof(struct _RegisterQueue));
    New->Msg = Req;
    New->Conn = conn;
    New->Next = NULL;
    if (Stream->ReaderRegisterQueue)
    {
        RegisterQueue Last = Stream->ReaderRegisterQueue;
        while (Last->Next)
        {
            Last = Last->Next;
        }
        Last->Next = New;
    }
    else
    {
        Stream->ReaderRegisterQueue = New;
    }
    STREAM_CONDITION_SIGNAL(Stream);
    STREAM_MUTEX_UNLOCK(Stream);
}